

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruckig.hpp
# Opt level: O0

bool __thiscall
ruckig::Ruckig<1UL,_ruckig::StandardVector,_true>::validate_input<true>
          (Ruckig<1UL,_ruckig::StandardVector,_true> *this,
          InputParameter<1UL,_ruckig::StandardVector> *input,bool check_current_state_within_limits,
          bool check_target_state_within_limits)

{
  bool bVar1;
  size_type sVar2;
  RuckigError *pRVar3;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_f9;
  string local_f8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_22;
  undefined1 local_21;
  bool check_target_state_within_limits_local;
  InputParameter<1UL,_ruckig::StandardVector> *pIStack_20;
  bool check_current_state_within_limits_local;
  InputParameter<1UL,_ruckig::StandardVector> *input_local;
  Ruckig<1UL,_ruckig::StandardVector,_true> *this_local;
  
  local_22 = check_target_state_within_limits;
  local_21 = check_current_state_within_limits;
  pIStack_20 = input;
  input_local = &this->current_input;
  bVar1 = InputParameter<1UL,_ruckig::StandardVector>::validate<true>
                    (input,check_current_state_within_limits,check_target_state_within_limits);
  if (bVar1) {
    bVar1 = std::vector<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>::empty
                      (&pIStack_20->intermediate_positions);
    if (((!bVar1) && (pIStack_20->control_interface == Position)) &&
       (sVar2 = std::vector<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>::
                size(&pIStack_20->intermediate_positions), this->max_number_of_waypoints < sVar2)) {
      local_f9 = 1;
      pRVar3 = (RuckigError *)__cxa_allocate_exception(0x10);
      sVar2 = std::vector<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>::size
                        (&pIStack_20->intermediate_positions);
      std::__cxx11::to_string(&local_c8,sVar2);
      std::operator+(&local_a8,"The number of intermediate positions ",&local_c8);
      std::operator+(&local_88,&local_a8," exceeds the maximum number of waypoints ");
      std::__cxx11::to_string(&local_f8,this->max_number_of_waypoints);
      std::operator+(&local_68,&local_88,&local_f8);
      std::operator+(&local_48,&local_68,".");
      RuckigError::RuckigError(pRVar3,&local_48);
      local_f9 = 0;
      __cxa_throw(pRVar3,&RuckigError::typeinfo,RuckigError::~RuckigError);
    }
    if ((this->delta_time <= 0.0) && (pIStack_20->duration_discretization != Continuous)) {
      pRVar3 = (RuckigError *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_160,this->delta_time);
      std::operator+(&local_140,"delta time (control rate) parameter ",&local_160);
      std::operator+(&local_120,&local_140," should be larger than zero.");
      RuckigError::RuckigError(pRVar3,&local_120);
      __cxa_throw(pRVar3,&RuckigError::typeinfo,RuckigError::~RuckigError);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool validate_input(const InputParameter<DOFs, CustomVector>& input, bool check_current_state_within_limits = false, bool check_target_state_within_limits = true) const {
        if (!input.template validate<throw_validation_error>(check_current_state_within_limits, check_target_state_within_limits)) {
            return false;
        }

        if (!input.intermediate_positions.empty() && input.control_interface == ControlInterface::Position) {
            if (input.intermediate_positions.size() > max_number_of_waypoints) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("The number of intermediate positions " + std::to_string(input.intermediate_positions.size()) + " exceeds the maximum number of waypoints " + std::to_string(max_number_of_waypoints) + ".");
                }
                return false;
            }
        }

        if (delta_time <= 0.0 && input.duration_discretization != DurationDiscretization::Continuous) {
            if constexpr (throw_validation_error) {
                throw RuckigError("delta time (control rate) parameter " + std::to_string(delta_time) + " should be larger than zero.");
            }
            return false;
        }

        return true;
    }